

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O2

uint __thiscall Atmosphere::layer_search(Atmosphere *this,double h)

{
  pointer pdVar1;
  uint uVar2;
  uint uVar3;
  
  pdVar1 = (this->H).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 1;
  while( true ) {
    uVar2 = uVar3 - 1;
    if ((ulong)((long)(this->H).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= (ulong)uVar2) {
      return 0;
    }
    if ((pdVar1[uVar2] <= h) && (h < pdVar1[uVar3])) break;
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

unsigned int layer_search(double h) {

        unsigned int layer = 0;
        for (unsigned int i = 0; i < this->H.size(); i++) {
            if (this->H[i] <= h && h < this->H[i + 1]) {
                layer = i;
                break;
            } else {
                continue;
            }
        }
        return layer;
    }